

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::TermPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,int depth)

{
  code *pcVar1;
  bool bVar2;
  EncodedChar EVar3;
  CharCount CVar4;
  CharCount CVar5;
  undefined4 *puVar6;
  EncodedChar *pEVar7;
  EncodedChar *pEVar8;
  EncodedChar *pEVar9;
  HRESULT error;
  uint lineNumber;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  pEVar7 = this->next;
  pEVar9 = this->tempLocationOfSurrogatePair;
  if (this->inputLim < pEVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00eb5b6d;
    *puVar6 = 0;
    pEVar7 = this->next;
  }
  EVar3 = *pEVar7;
  if ((ushort)EVar3 < 0x3f) {
    switch(EVar3) {
    case L'$':
switchD_00eb4f03_caseD_5e:
      if (pEVar7 + 1 <= this->inputLim) {
LAB_00eb508f:
        this->next = pEVar7 + 1;
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (bVar2) {
        *puVar6 = 0;
        pEVar7 = this->next;
        goto LAB_00eb508f;
      }
      goto LAB_00eb5b6d;
    case L'%':
    case L'&':
    case L'\'':
    case L',':
    case L'-':
      goto switchD_00eb502a_caseD_25;
    case L'(':
      this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
      this->codePointAtTempLocation = 0;
      pEVar9 = this->inputLim;
      if (pEVar9 < pEVar7 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar9 = this->inputLim;
        pEVar7 = this->next;
      }
      pEVar7 = pEVar7 + 1;
      this->next = pEVar7;
      if (pEVar9 < pEVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar7 = this->next;
      }
      if (*pEVar7 == L'?') {
        pEVar9 = this->inputLim;
        if (pEVar9 < pEVar7 + 2) {
          Fail(this,-0x7ff5ec67);
          pEVar9 = this->inputLim;
          pEVar7 = this->next;
        }
        if (pEVar9 < pEVar7 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar2) goto LAB_00eb5b6d;
          *puVar6 = 0;
          pEVar7 = this->next;
        }
        if ((0x3d < (ulong)(ushort)pEVar7[1]) ||
           ((0x2400000200000000U >> ((ulong)(ushort)pEVar7[1] & 0x3f) & 1) == 0)) goto LAB_00eb5645;
        if (this->inputLim < pEVar7 + 2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar2) goto LAB_00eb5b6d;
          *puVar6 = 0;
          pEVar7 = this->next;
        }
        this->next = pEVar7 + 2;
      }
      else {
LAB_00eb5645:
        this->numGroups = this->numGroups + 1;
      }
      DisjunctionPass0(this,depth + 1);
      pEVar9 = this->next;
      if (this->inputLim < pEVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar9 = this->next;
      }
      if (*pEVar9 != L')') {
        Fail(this,-0x7ff5ec64);
        pEVar9 = this->next;
      }
      if (this->inputLim < pEVar9 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar9 = this->next;
      }
      this->next = pEVar9 + 1;
      goto LAB_00eb5775;
    case L')':
switchD_00eb502a_caseD_29:
      error = -0x7ff5ec67;
      goto LAB_00eb5752;
    case L'*':
    case L'+':
      goto switchD_00eb502a_caseD_2a;
    case L'.':
      if (this->inputLim < pEVar7 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar7 = this->next;
      }
      this->next = pEVar7 + 1;
      goto LAB_00eb5757;
    }
    if ((EVar3 == L'\0') && (this->inputLim <= pEVar7)) {
      Fail(this,-0x7ff5ec67);
      pEVar7 = this->next;
    }
switchD_00eb502a_caseD_25:
    pEVar8 = pEVar7;
    if (this->inputLim <= pEVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar2) goto LAB_00eb5b6d;
      *puVar6 = 0;
      pEVar8 = this->next;
    }
    this->next = pEVar8 + 1;
    EVar3 = *pEVar8;
    if ((ulong)(ushort)EVar3 < 0x100) {
      if ((ASCIIChars::classes[(ushort)EVar3] & 2) != 0) {
LAB_00eb55ac:
        Fail(this,-0x7ff5fc0c);
      }
    }
    else if ((EVar3 & 0xfffeU) == 0x2028) goto LAB_00eb55ac;
    if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
      TrackIfSurrogatePair
                (this,(uint)(ushort)EVar3,pEVar7,
                 (uint32)((ulong)((long)this->next - (long)pEVar7) >> 1));
    }
    if (EVar3 == L'/') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x4e7,"(!IsLiteral || c != \'/\')","!IsLiteral || c != \'/\'");
      if (!bVar2) goto LAB_00eb5b6d;
      *puVar6 = 0;
    }
  }
  else if ((ushort)EVar3 < 0x7b) {
    switch(EVar3) {
    case L'[':
      if (this->inputLim < pEVar7 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar7 = this->next;
      }
      this->next = pEVar7 + 1;
      this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
      this->codePointAtTempLocation = 0;
      this->tempLocationOfRange = pEVar7 + 1;
      CharacterClassPass0(this);
      this->tempLocationOfRange = (EncodedChar *)0x0;
      pEVar7 = this->next;
      if (this->inputLim < pEVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar7 = this->next;
      }
      if (*pEVar7 != L']') {
        Fail(this,-0x7ff5ec65);
        goto LAB_00eb511d;
      }
      break;
    case L'\\':
      if (this->inputLim < pEVar7 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar7 = this->next;
      }
      this->next = pEVar7 + 1;
      bVar2 = AtomEscapePass0(this);
      if (bVar2) {
        return;
      }
      goto LAB_00eb5757;
    case L']':
      goto switchD_00eb4f03_caseD_5d;
    case L'^':
      goto switchD_00eb4f03_caseD_5e;
    default:
      if (EVar3 != L'?') goto switchD_00eb502a_caseD_25;
switchD_00eb502a_caseD_2a:
      bVar2 = AtQuantifier(this);
      if (bVar2) {
        error = -0x7ff5ec66;
        goto LAB_00eb5752;
      }
LAB_00eb511d:
      pEVar7 = this->next;
    }
    if (this->inputLim < pEVar7 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00eb5b6d;
      *puVar6 = 0;
      pEVar7 = this->next;
    }
    this->next = pEVar7 + 1;
  }
  else {
    if (EVar3 == L'{') goto switchD_00eb502a_caseD_2a;
    if (EVar3 == L'|') goto switchD_00eb502a_caseD_29;
    if (EVar3 != L'}') goto switchD_00eb502a_caseD_25;
switchD_00eb4f03_caseD_5d:
    if (pEVar7 < this->inputLim) {
      this->next = pEVar7 + 1;
LAB_00eb5586:
      if ((ASCIIChars::classes[(ushort)EVar3] & 2) == 0) goto LAB_00eb5757;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar2) goto LAB_00eb5b6d;
      *puVar6 = 0;
      EVar3 = *this->next;
      this->next = this->next + 1;
      if ((ushort)EVar3 < 0x100) goto LAB_00eb5586;
      if ((EVar3 & 0xfffeU) != 0x2028) goto LAB_00eb5757;
    }
    error = -0x7ff5fc0c;
LAB_00eb5752:
    Fail(this,error);
  }
LAB_00eb5757:
  if ((pEVar9 != (EncodedChar *)0x0) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
  }
LAB_00eb5775:
  bVar2 = AtQuantifier(this);
  if (!bVar2) {
    return;
  }
  pEVar9 = this->next;
  if (this->inputLim < pEVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00eb5b6d;
    *puVar6 = 0;
    pEVar9 = this->next;
  }
  EVar3 = *pEVar9;
  if (1 < (ushort)EVar3 - 0x2a) {
    if (EVar3 == L'{') {
      if (this->inputLim < pEVar9 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar9 = this->next;
      }
      this->next = pEVar9 + 1;
      CVar4 = RepeatCount(this);
      pEVar9 = this->next;
      if (this->inputLim < pEVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb5b6d;
        *puVar6 = 0;
        pEVar9 = this->next;
      }
      if (*pEVar9 != L'}') {
        if (*pEVar9 == L',') {
          pEVar7 = this->inputLim;
          if (pEVar7 < pEVar9 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar2) goto LAB_00eb5b6d;
            *puVar6 = 0;
            pEVar7 = this->inputLim;
            pEVar9 = this->next;
          }
          pEVar9 = pEVar9 + 1;
          this->next = pEVar9;
          if (pEVar7 < pEVar9) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar2) goto LAB_00eb5b6d;
            *puVar6 = 0;
            pEVar9 = this->next;
          }
          if (*pEVar9 != L'}') {
            CVar5 = RepeatCount(this);
            if (CVar5 < CVar4) {
              Fail(this,-0x7ff5ec67);
            }
            EVar3 = ECLookahead(this,0);
            if (EVar3 != L'}') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar6 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x50e,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
              if (!bVar2) goto LAB_00eb5b6d;
              *puVar6 = 0;
            }
          }
          ECConsume(this,1);
          goto LAB_00eb5b04;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        lineNumber = 0x518;
        goto LAB_00eb5b55;
      }
    }
    else if (EVar3 != L'?') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      lineNumber = 0x51e;
LAB_00eb5b55:
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,lineNumber,"(false)","false");
      if (bVar2) {
        *puVar6 = 0;
        return;
      }
      goto LAB_00eb5b6d;
    }
  }
  if (this->inputLim < pEVar9 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) {
LAB_00eb5b6d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    pEVar9 = this->next;
  }
  this->next = pEVar9 + 1;
LAB_00eb5b04:
  OptNonGreedy(this);
  return;
}

Assistant:

void Parser<P, IsLiteral>::TermPass0(int depth)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        // Either we have a location at the start, or the end, never both. As in between it should have been cleared if surrogate pair
        // Or must be cleared if we didn't perform the check
        bool clearLocationIfPresent = this->tempLocationOfSurrogatePair != nullptr;

        switch (ECLookahead())
        {
        case '^':
        case '$':
            ECConsume();
            return;
        case '\\':
            ECConsume();
            if (AtomEscapePass0())
                return;
            break;
        case '(':
            // Can't combine into a single codeunit because of group present
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            clearLocationIfPresent = false;
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                if (!ECCanConsume(2))
                    Fail(JSERR_RegExpSyntax);
                switch (ECLookahead(1))
                {
                case '=':
                case '!':
                case ':':
                    ECConsume(2);
                    break;
                default:
                    numGroups++;
                    break;
                }
                break;
            default:
                numGroups++;
                break;
            }
            DisjunctionPass0(depth + 1);
            ECMust(')', JSERR_RegExpNoParen);
            break;
        case '.':
            ECConsume();
            break;
        case '[':
            ECConsume();
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            this->tempLocationOfRange = next;
            CharacterClassPass0();
            this->tempLocationOfRange = nullptr;
            ECMust(']', JSERR_RegExpNoBracket);
            break;
        case ')':
        case '|':
            Fail(JSERR_RegExpSyntax);
            break;
        case ']':
        case '}':
            NextChar();
            break;
        case '*':
        case '+':
        case '?':
        case '{':
            if (AtQuantifier())
                Fail(JSERR_RegExpBadQuant);
            else
                ECConsume();
            break;
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            {
                const EncodedChar* current = next;
                Char c = NextChar();
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(c, current, (uint32)(next - current));
                }
                // Closing '/' in literals should be caught explicitly
                Assert(!IsLiteral || c != '/');
            }
            break;
        }

        if (clearLocationIfPresent && this->tempLocationOfSurrogatePair != nullptr)
        {
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
            case '+':
            case '?':
                ECConsume();
                OptNonGreedy();
                break;
            case '{':
                {
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            OptNonGreedy();
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            if (upper < lower)
                                Fail(JSERR_RegExpSyntax);
                            Assert(ECLookahead() == '}');
                            ECConsume();
                            OptNonGreedy();
                        }
                        break;
                    case '}':
                        ECConsume();
                        OptNonGreedy();
                        break;
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }
    }